

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall FloatTokenizerRule::~FloatTokenizerRule(FloatTokenizerRule *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

std::pair<bool, std::size_t> handleFraction(
    const std::shared_ptr<Readable>& reader,
    std::size_t i) {

    if (reader->charAt(i) != '.') {
      return std::make_pair(false, 0);
    }

    i++;

    while (isNumeric(reader->charAt(i))) {
      i++;
    }

    return std::make_pair(true, i);
  }